

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O0

ushort __thiscall
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::AddDisposedObjectFreeBitVector
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this,
          SmallHeapBlockBitVector *free)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  uint bitIndex_00;
  undefined4 *puVar5;
  SmallHeapBlockBitVector *this_00;
  FreeObject *pFStack_28;
  uint bitIndex;
  FreeObject *freeObject;
  ushort freeCount;
  SmallHeapBlockBitVector *free_local;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  freeObject._6_2_ = 0;
  pFStack_28 = this->disposedObjectList;
  if (pFStack_28 != (FreeObject *)0x0) {
    while( true ) {
      uVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddressBitIndex(pFStack_28);
      bitIndex_00 = (uint)uVar4;
      bVar2 = SmallHeapBlockT<SmallAllocationBlockAttributes>::IsValidBitIndex
                        ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this,bitIndex_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                           ,0x21f,"(this->IsValidBitIndex(bitIndex))",
                           "this->IsValidBitIndex(bitIndex)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_00 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetDebugFreeBitVector
                          ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this);
      BVar3 = BVStatic<256UL>::Test(this_00,bitIndex_00);
      if (BVar3 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                           ,0x222,"(!this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "!this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      BVStatic<256UL>::Set(free,bitIndex_00);
      freeObject._6_2_ = freeObject._6_2_ + 1;
      if (pFStack_28 == this->disposedObjectListTail) break;
      pFStack_28 = FreeObject::GetNext(pFStack_28);
    }
  }
  return freeObject._6_2_;
}

Assistant:

ushort
SmallFinalizableHeapBlockT<TBlockAttributes>::AddDisposedObjectFreeBitVector(SmallHeapBlockBitVector * free)
{
    // all the finalized object are considered freed, but not allocable yet
    ushort freeCount = 0;
    FreeObject * freeObject = this->disposedObjectList;

    if (freeObject != nullptr)
    {
        while (true)
        {
            uint bitIndex = this->GetAddressBitIndex(freeObject);
            Assert(this->IsValidBitIndex(bitIndex));

            // not allocable yet
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));

            // but in the free list to mark can skip scanning the object
            free->Set(bitIndex);
            freeCount++;

            if (freeObject == this->disposedObjectListTail)
            {
                break;
            }
            freeObject = freeObject->GetNext();
        }
    }
    return freeCount;
}